

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall
imrt::Plan::Plan(Plan *this,vector<double,_std::allocator<double>_> *w,
                vector<double,_std::allocator<double>_> *Zmin,
                vector<double,_std::allocator<double>_> *Zmax,Collimator *collimator,
                vector<imrt::Volume,_std::allocator<imrt::Volume>_> *volumes,int max_apertures,
                int max_intensity,int initial_intensity,int step_intensity,int open_apertures,
                int setup,char *file)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  int iVar3;
  EvaluationFunction *pEVar4;
  fstream *this_00;
  Station *this_01;
  _List_node_base *p_Var5;
  mapped_type *ppSVar6;
  ostream *poVar7;
  int i;
  double dVar8;
  int local_5c;
  vector<double,_std::allocator<double>_> *local_58;
  vector<double,_std::allocator<double>_> *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
  *local_40;
  vector<double,_std::allocator<double>_> *local_38;
  
  this->_vptr_Plan = (_func_int **)&PTR__Plan_0012bc70;
  local_40 = &this->angle2station;
  p_Var1 = &(this->angle2station)._M_t._M_impl.super__Rb_tree_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node._M_size = 0;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  local_38 = Zmax;
  pEVar4 = EvaluationFunction::getInstance(volumes,collimator);
  this->ev = pEVar4;
  local_48 = &this->w;
  std::vector<double,_std::allocator<double>_>::vector(local_48,w);
  local_50 = &this->Zmin;
  std::vector<double,_std::allocator<double>_>::vector(local_50,Zmin);
  local_58 = &this->Zmax;
  std::vector<double,_std::allocator<double>_>::vector(local_58,local_38);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##Initilizing plan.",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  i = 0;
  if (file == (char *)0x0) {
    this_00 = (fstream *)0x0;
  }
  else {
    this_00 = (fstream *)operator_new(0x210);
    std::fstream::fstream(this_00,file,_S_in);
    i = 0;
  }
  while( true ) {
    iVar3 = Collimator::getNbAngles(collimator);
    if (iVar3 <= i) break;
    this_01 = (Station *)operator_new(0x170);
    iVar3 = Collimator::getAngle(collimator,i);
    Station::Station(this_01,collimator,volumes,iVar3,max_apertures,max_intensity,initial_intensity,
                     step_intensity,open_apertures,setup,(fstream *)this_00);
    p_Var5 = (_List_node_base *)operator_new(0x18);
    p_Var5[1]._M_next = (_List_node_base *)this_01;
    std::__detail::_List_node_base::_M_hook(p_Var5);
    psVar2 = &(this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
              _M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    local_5c = Collimator::getAngle(collimator,i);
    ppSVar6 = std::
              map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
              ::operator[](local_40,&local_5c);
    *ppSVar6 = this_01;
    i = i + 1;
  }
  if (this_00 != (fstream *)0x0) {
    std::fstream::close();
    (**(code **)(*(long *)this_00 + 8))(this_00);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"##  Created ",0xc);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," stations.",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  dVar8 = EvaluationFunction::eval(this->ev,this,local_48,local_50,local_58);
  EvaluationFunction::generate_voxel_dose_functions(this->ev);
  this->evaluation_fx = dVar8;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"##  Initial evaluation: ",0x18);
  poVar7 = std::ostream::_M_insert<double>(this->evaluation_fx);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  this->last_changed = (Station *)0x0;
  return;
}

Assistant:

Plan::Plan(vector<double> w, vector<double> Zmin, vector<double> Zmax, Collimator& collimator,
             vector<Volume>& volumes, int max_apertures, int max_intensity, int initial_intensity,
             int step_intensity, int open_apertures, int setup, char* file) :
             ev(EvaluationFunction::getInstance(volumes, collimator)), w(w), Zmin(Zmin), Zmax(Zmax) {

    cout << "##Initilizing plan."<< endl;


    fstream* myfile=NULL;
    if(file) myfile=new fstream(file, std::ios_base::in);

    for (int i=0;i<collimator.getNbAngles();i++) {
      Station* station = new Station(collimator, volumes, collimator.getAngle(i), max_apertures,
                                     max_intensity, initial_intensity, step_intensity, open_apertures, setup, myfile);
      add_station(*station);
      angle2station[collimator.getAngle(i)]=station;
    }
    if(myfile){
    	myfile->close();
        delete myfile;
    }
    cout << "##  Created " << stations.size() << " stations."<< endl;
    eval();
    cout << "##  Initial evaluation: " << evaluation_fx << "."<< endl;
    last_changed=NULL;

    //ev.create_beam2voxel_list(*this);
  }